

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O2

string * __thiscall helics::BrokerApp::getAddress_abi_cxx11_(BrokerApp *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (getAddress[abi:cxx11]()::estring_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&getAddress[abi:cxx11]()::estring_abi_cxx11_);
    if (iVar2 != 0) {
      getAddress[abi:cxx11]()::estring_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getAddress[abi:cxx11]()::estring_abi_cxx11_.field_2;
      getAddress[abi:cxx11]()::estring_abi_cxx11_._M_string_length = 0;
      getAddress[abi:cxx11]()::estring_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&getAddress[abi:cxx11]()::estring_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getAddress[abi:cxx11]()::estring_abi_cxx11_);
    }
  }
  peVar1 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_Broker[0xc])();
    return (string *)CONCAT44(extraout_var,iVar2);
  }
  return &getAddress[abi:cxx11]()::estring_abi_cxx11_;
}

Assistant:

const std::string& BrokerApp::getAddress() const
{
    static const std::string estring;
    return (broker) ? broker->getAddress() : estring;
}